

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fkLookupParent(Parse *pParse,int iDb,Table *pTab,Index *pIdx,FKey *pFKey,int *aiCol,int regData
                   ,int nIncr,int isIgnore)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  Parse *pPVar4;
  uint p2;
  int iVar5;
  int p3;
  uint uVar6;
  Vdbe *p;
  KeyInfo *zP4;
  char *zP4_00;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  
  p = sqlite3GetVdbe(pParse);
  iVar7 = pParse->nTab;
  p2 = sqlite3VdbeMakeLabel(p);
  if (nIncr < 0) {
    sqlite3VdbeAddOp2(p,0x76,(uint)pFKey->isDeferred,p2);
  }
  iVar7 = iVar7 + -1;
  iVar12 = regData + 1;
  for (lVar9 = 0; uVar6 = pFKey->nCol, lVar9 < (int)uVar6; lVar9 = lVar9 + 1) {
    sqlite3VdbeAddOp2(p,0x49,aiCol[lVar9] + iVar12,p2);
  }
  if (isIgnore == 0) {
    if (pIdx == (Index *)0x0) {
      iVar5 = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp2(p,0xf,iVar12 + *aiCol,iVar5);
      uVar6 = sqlite3VdbeAddOp2(p,0x15,iVar5,0);
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        sqlite3VdbeAddOp3(p,0x4c,regData,p2,iVar5);
      }
      sqlite3OpenTable(pParse,iVar7,iDb,pTab,0x27);
      sqlite3VdbeAddOp3(p,0x36,iVar7,0,iVar5);
      sqlite3VdbeAddOp2(p,1,0,p2);
      uVar3 = p->nOp;
      if (1 < (int)uVar3) {
        p->aOp[uVar3 - 2].p2 = uVar3;
      }
      if (uVar6 < uVar3 && -1 < (int)uVar6) {
        p->aOp[uVar6].p2 = uVar3;
      }
      sqlite3ReleaseTempReg(pParse,iVar5);
    }
    else {
      iVar5 = sqlite3GetTempRange(pParse,uVar6);
      p3 = sqlite3GetTempReg(pParse);
      zP4 = sqlite3IndexKeyinfo(pParse,pIdx);
      sqlite3VdbeAddOp3(p,0x27,iVar7,pIdx->tnum,iDb);
      sqlite3VdbeChangeP4(p,-1,(char *)zP4,-0x10);
      uVar10 = 0;
      uVar11 = 0;
      if (0 < (int)uVar6) {
        uVar11 = (ulong)uVar6;
      }
      for (; uVar11 != uVar10; uVar10 = uVar10 + 1) {
        sqlite3VdbeAddOp2(p,0xe,aiCol[uVar10] + iVar12,iVar5 + (int)uVar10);
      }
      if ((nIncr == 1) && (pFKey->pFrom == pTab)) {
        iVar2 = p->nOp;
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          iVar8 = pIdx->aiColumn[uVar10] + 1;
          if (pIdx->aiColumn[uVar10] == (int)pTab->iPKey) {
            iVar8 = 0;
          }
          sqlite3VdbeAddOp3(p,0x4b,aiCol[uVar10] + iVar12,iVar2 + uVar6 + 1,iVar8 + regData);
          if (p->aOp != (Op *)0x0) {
            p->aOp[(long)p->nOp + -1].p5 = '\b';
          }
        }
        sqlite3VdbeAddOp2(p,1,0,p2);
      }
      sqlite3VdbeAddOp3(p,0x1f,iVar5,uVar6,p3);
      zP4_00 = sqlite3IndexAffinityStr(p,pIdx);
      sqlite3VdbeChangeP4(p,-1,zP4_00,0);
      sqlite3VdbeAddOp4Int(p,0x34,iVar7,p2,p3,0);
      sqlite3ReleaseTempReg(pParse,p3);
      sqlite3ReleaseTempRange(pParse,iVar5,uVar6);
    }
  }
  bVar1 = pFKey->isDeferred;
  if (bVar1 == 0) {
    pPVar4 = pParse->pToplevel;
    if ((pPVar4 == (Parse *)0x0) && (pParse->isMultiWrite == '\0')) {
      sqlite3HaltConstraint(pParse,0x313,2,"foreign key constraint failed",-2);
      goto LAB_001610ee;
    }
    if (0 < nIncr) {
      if (pPVar4 != (Parse *)0x0) {
        pParse = pPVar4;
      }
      pParse->mayAbort = '\x01';
    }
  }
  sqlite3VdbeAddOp2(p,0x75,(uint)bVar1,nIncr);
LAB_001610ee:
  if (p->aLabel != (int *)0x0) {
    p->aLabel[(int)~p2] = p->nOp;
  }
  sqlite3VdbeAddOp1(p,0x2d,iVar7);
  return;
}

Assistant:

static void fkLookupParent(
  Parse *pParse,        /* Parse context */
  int iDb,              /* Index of database housing pTab */
  Table *pTab,          /* Parent table of FK pFKey */
  Index *pIdx,          /* Unique index on parent key columns in pTab */
  FKey *pFKey,          /* Foreign key constraint */
  int *aiCol,           /* Map from parent key columns to child table columns */
  int regData,          /* Address of array containing child table row */
  int nIncr,            /* Increment constraint counter by this */
  int isIgnore          /* If true, pretend pTab contains all NULL values */
){
  int i;                                    /* Iterator variable */
  Vdbe *v = sqlite3GetVdbe(pParse);         /* Vdbe to add code to */
  int iCur = pParse->nTab - 1;              /* Cursor number to use */
  int iOk = sqlite3VdbeMakeLabel(v);        /* jump here if parent key found */

  /* If nIncr is less than zero, then check at runtime if there are any
  ** outstanding constraints to resolve. If there are not, there is no need
  ** to check if deleting this row resolves any outstanding violations.
  **
  ** Check if any of the key columns in the child table row are NULL. If 
  ** any are, then the constraint is considered satisfied. No need to 
  ** search for a matching row in the parent table.  */
  if( nIncr<0 ){
    sqlite3VdbeAddOp2(v, OP_FkIfZero, pFKey->isDeferred, iOk);
  }
  for(i=0; i<pFKey->nCol; i++){
    int iReg = aiCol[i] + regData + 1;
    sqlite3VdbeAddOp2(v, OP_IsNull, iReg, iOk);
  }

  if( isIgnore==0 ){
    if( pIdx==0 ){
      /* If pIdx is NULL, then the parent key is the INTEGER PRIMARY KEY
      ** column of the parent table (table pTab).  */
      int iMustBeInt;               /* Address of MustBeInt instruction */
      int regTemp = sqlite3GetTempReg(pParse);
  
      /* Invoke MustBeInt to coerce the child key value to an integer (i.e. 
      ** apply the affinity of the parent key). If this fails, then there
      ** is no matching parent key. Before using MustBeInt, make a copy of
      ** the value. Otherwise, the value inserted into the child key column
      ** will have INTEGER affinity applied to it, which may not be correct.  */
      sqlite3VdbeAddOp2(v, OP_SCopy, aiCol[0]+1+regData, regTemp);
      iMustBeInt = sqlite3VdbeAddOp2(v, OP_MustBeInt, regTemp, 0);
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter.  */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        sqlite3VdbeAddOp3(v, OP_Eq, regData, iOk, regTemp);
      }
  
      sqlite3OpenTable(pParse, iCur, iDb, pTab, OP_OpenRead);
      sqlite3VdbeAddOp3(v, OP_NotExists, iCur, 0, regTemp);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, iOk);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      sqlite3VdbeJumpHere(v, iMustBeInt);
      sqlite3ReleaseTempReg(pParse, regTemp);
    }else{
      int nCol = pFKey->nCol;
      int regTemp = sqlite3GetTempRange(pParse, nCol);
      int regRec = sqlite3GetTempReg(pParse);
      KeyInfo *pKey = sqlite3IndexKeyinfo(pParse, pIdx);
  
      sqlite3VdbeAddOp3(v, OP_OpenRead, iCur, pIdx->tnum, iDb);
      sqlite3VdbeChangeP4(v, -1, (char*)pKey, P4_KEYINFO_HANDOFF);
      for(i=0; i<nCol; i++){
        sqlite3VdbeAddOp2(v, OP_Copy, aiCol[i]+1+regData, regTemp+i);
      }
  
      /* If the parent table is the same as the child table, and we are about
      ** to increment the constraint-counter (i.e. this is an INSERT operation),
      ** then check if the row being inserted matches itself. If so, do not
      ** increment the constraint-counter. 
      **
      ** If any of the parent-key values are NULL, then the row cannot match 
      ** itself. So set JUMPIFNULL to make sure we do the OP_Found if any
      ** of the parent-key values are NULL (at this point it is known that
      ** none of the child key values are).
      */
      if( pTab==pFKey->pFrom && nIncr==1 ){
        int iJump = sqlite3VdbeCurrentAddr(v) + nCol + 1;
        for(i=0; i<nCol; i++){
          int iChild = aiCol[i]+1+regData;
          int iParent = pIdx->aiColumn[i]+1+regData;
          assert( aiCol[i]!=pTab->iPKey );
          if( pIdx->aiColumn[i]==pTab->iPKey ){
            /* The parent key is a composite key that includes the IPK column */
            iParent = regData;
          }
          sqlite3VdbeAddOp3(v, OP_Ne, iChild, iJump, iParent);
          sqlite3VdbeChangeP5(v, SQLITE_JUMPIFNULL);
        }
        sqlite3VdbeAddOp2(v, OP_Goto, 0, iOk);
      }
  
      sqlite3VdbeAddOp3(v, OP_MakeRecord, regTemp, nCol, regRec);
      sqlite3VdbeChangeP4(v, -1, sqlite3IndexAffinityStr(v,pIdx), P4_TRANSIENT);
      sqlite3VdbeAddOp4Int(v, OP_Found, iCur, iOk, regRec, 0);
  
      sqlite3ReleaseTempReg(pParse, regRec);
      sqlite3ReleaseTempRange(pParse, regTemp, nCol);
    }
  }

  if( !pFKey->isDeferred && !pParse->pToplevel && !pParse->isMultiWrite ){
    /* Special case: If this is an INSERT statement that will insert exactly
    ** one row into the table, raise a constraint immediately instead of
    ** incrementing a counter. This is necessary as the VM code is being
    ** generated for will not open a statement transaction.  */
    assert( nIncr==1 );
    sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
        OE_Abort, "foreign key constraint failed", P4_STATIC
    );
  }else{
    if( nIncr>0 && pFKey->isDeferred==0 ){
      sqlite3ParseToplevel(pParse)->mayAbort = 1;
    }
    sqlite3VdbeAddOp2(v, OP_FkCounter, pFKey->isDeferred, nIncr);
  }

  sqlite3VdbeResolveLabel(v, iOk);
  sqlite3VdbeAddOp1(v, OP_Close, iCur);
}